

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QDBusListener::DBusKey>::moveAppend
          (QGenericArrayOps<QDBusListener::DBusKey> *this,DBusKey *b,DBusKey *e)

{
  qsizetype *pqVar1;
  DBusKey *pDVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pDVar2 = (this->super_QArrayDataPointer<QDBusListener::DBusKey>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QDBusListener::DBusKey>).size;
      pDVar4 = (b->location).d.d;
      (b->location).d.d = (Data *)0x0;
      pDVar2[lVar3].location.d.d = pDVar4;
      pcVar5 = (b->location).d.ptr;
      (b->location).d.ptr = (char16_t *)0x0;
      pDVar2[lVar3].location.d.ptr = pcVar5;
      qVar6 = (b->location).d.size;
      (b->location).d.size = 0;
      pDVar2[lVar3].location.d.size = qVar6;
      pDVar4 = (b->key).d.d;
      (b->key).d.d = (Data *)0x0;
      pDVar2[lVar3].key.d.d = pDVar4;
      pcVar5 = (b->key).d.ptr;
      (b->key).d.ptr = (char16_t *)0x0;
      pDVar2[lVar3].key.d.ptr = pcVar5;
      qVar6 = (b->key).d.size;
      (b->key).d.size = 0;
      pDVar2[lVar3].key.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QDBusListener::DBusKey>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }